

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

void bitset_inplace_intersection(bitset_t *b1,bitset_t *b2)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = b1->arraysize;
  uVar2 = b2->arraysize;
  uVar5 = uVar2;
  if (uVar1 < uVar2) {
    uVar5 = uVar1;
  }
  if (uVar5 != 0) {
    puVar3 = b2->array;
    puVar4 = b1->array;
    uVar6 = 0;
    do {
      puVar4[uVar6] = puVar4[uVar6] & puVar3[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  if (uVar2 < uVar1) {
    memset(b1->array + uVar5,0,(uVar1 - uVar5) * 8);
    return;
  }
  return;
}

Assistant:

void bitset_inplace_intersection(bitset_t *CBITSET_RESTRICT b1,
                                 const bitset_t *CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    for (; k < minlength; ++k) {
        b1->array[k] &= b2->array[k];
    }
    for (; k < b1->arraysize; ++k) {
        b1->array[k] = 0;  // memset could, maybe, be a tiny bit faster
    }
}